

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockIterator.hpp
# Opt level: O2

bool __thiscall
gmlc::containers::BlockIterator<helics::Publication_const,32,helics::Publication_const*const*>::
checkEquivalence<helics::Publication**>
          (BlockIterator<const_helics::Publication,_32,_const_helics::Publication_*const_*> *this,
          Publication **testv,int testoffset)

{
  Publication **ppPVar1;
  
  ppPVar1 = this->vec;
  if ((ppPVar1 != testv) &&
     ((((testv == (Publication **)0x0 || (ppPVar1 == (Publication **)0x0)) ||
       (*testv != (Publication *)0x0)) || (*ppPVar1 != (Publication *)0x0)))) {
    return false;
  }
  return this->offset == testoffset;
}

Assistant:

bool checkEquivalence(OUTER2 testv, int testoffset) const
        {
            return (
                (testv == vec ||
                 ((testv != nullptr && *testv == nullptr) &&
                  (vec != nullptr && *vec == nullptr))) &&
                testoffset == offset);
        }